

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O1

void gpioStopThread(pthread_t *pth)

{
  pthread_t pVar1;
  
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    gpioStopThread_cold_1();
  }
  if ((libInitialised == '\0') && ((gpioCfg.internals >> 10 & 1) == 0)) {
    gpioStopThread_cold_2();
  }
  if (pth != (pthread_t *)0x0) {
    pVar1 = pthread_self();
    if (pVar1 != *pth) {
      pthread_cancel(*pth);
      pthread_join(*pth,(void **)0x0);
      free(pth);
      return;
    }
    free(pth);
    pthread_exit((void *)0x0);
  }
  return;
}

Assistant:

void gpioStopThread(pthread_t *pth)
{
   DBG(DBG_USER, "pth=%08"PRIXPTR, (uintptr_t)pth);

   CHECK_INITED_RET_NIL;

   if (pth)
   {
      if (pthread_self() == *pth)
      {
         free(pth);
         pthread_exit(NULL);
      }
      else
      {
         pthread_cancel(*pth);
         pthread_join(*pth, NULL);
         free(pth);
      }
   }
}